

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaa.c
# Opt level: O3

int IDAApolynomialGetY(IDAMem IDA_mem,sunrealtype t,N_Vector yy,N_Vector yp,N_Vector *yyS,
                      N_Vector *ypS)

{
  IDAadjMemRec *pIVar1;
  IDAdtpntMemRec **ppIVar2;
  IDAdtpntMemRec *pIVar3;
  undefined8 *puVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  sunrealtype *psVar12;
  ulong uVar13;
  ulong uVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar22;
  undefined1 auVar23 [16];
  double dVar24;
  int iVar25;
  int newpoint;
  long index;
  sunrealtype **local_d8;
  double local_d0;
  int local_c4;
  sunrealtype local_c0;
  double local_b8;
  ulong uStack_b0;
  IDAdtpntMemRec **local_a8;
  ulong uStack_a0;
  undefined1 local_98 [16];
  N_Vector *local_80;
  N_Vector *local_78;
  N_Vector local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  N_Vector local_48;
  ulong local_40;
  double local_38;
  long lVar21;
  
  pIVar1 = IDA_mem->ida_adj_mem;
  uVar13 = 0;
  if ((yyS != (N_Vector *)0x0) && (pIVar1->ia_interpSensi != 0)) {
    uVar13 = (ulong)(uint)IDA_mem->ida_Ns;
  }
  ppIVar2 = pIVar1->dt_mem;
  local_c0 = t;
  local_80 = ypS;
  local_78 = yyS;
  local_70 = yy;
  iVar6 = IDAAfindIndex(IDA_mem,t,(long *)&local_38,&local_c4);
  auVar19 = local_98;
  if (iVar6 != 0) {
    return iVar6;
  }
  iVar6 = (int)uVar13;
  local_a8 = ppIVar2;
  if (local_38 == 0.0) {
    puVar4 = (undefined8 *)(*ppIVar2)->content;
    N_VScale(0x3ff0000000000000,*puVar4,local_70);
    N_VScale(0x3ff0000000000000,puVar4[2],yp);
    auVar19 = _DAT_00134060;
    if (iVar6 < 1) {
      return 0;
    }
    psVar12 = IDA_mem->ida_cvals;
    lVar10 = uVar13 - 1;
    auVar16._8_4_ = (int)lVar10;
    auVar16._0_8_ = lVar10;
    auVar16._12_4_ = (int)((ulong)lVar10 >> 0x20);
    lVar10 = 0;
    auVar16 = auVar16 ^ _DAT_00134060;
    auVar23 = _DAT_00134050;
    do {
      bVar5 = auVar16._0_4_ < SUB164(auVar23 ^ auVar19,0);
      iVar7 = auVar16._4_4_;
      iVar25 = SUB164(auVar23 ^ auVar19,4);
      if ((bool)(~(iVar7 < iVar25 || iVar25 == iVar7 && bVar5) & 1)) {
        *(undefined8 *)((long)psVar12 + lVar10) = 0x3ff0000000000000;
      }
      if (iVar7 >= iVar25 && (iVar25 != iVar7 || !bVar5)) {
        *(undefined8 *)((long)psVar12 + lVar10 + 8) = 0x3ff0000000000000;
      }
      lVar8 = auVar23._8_8_;
      auVar23._0_8_ = auVar23._0_8_ + 2;
      auVar23._8_8_ = lVar8 + 2;
      lVar10 = lVar10 + 0x10;
    } while ((ulong)(iVar6 + 1U >> 1) << 4 != lVar10);
    iVar6 = N_VScaleVectorArray(uVar13,psVar12,puVar4[1],local_78);
    if (iVar6 != 0) {
      return -0x1c;
    }
    iVar6 = N_VScaleVectorArray(uVar13,IDA_mem->ida_cvals,puVar4[3],local_80);
    goto LAB_0011984e;
  }
  local_58._0_8_ = ABS(ppIVar2[(long)local_38]->t - ppIVar2[(long)local_38 - 1]->t);
  local_58._8_8_ = 0;
  dVar15 = (double)local_58._0_8_;
  local_48 = yp;
  if (pIVar1->ia_tfinal <= pIVar1->ia_tinitial) {
    uVar11 = *(uint *)((long)ppIVar2[(long)local_38 - 1]->content + 0x20);
    local_d0 = (double)(long)(int)uVar11;
    local_b8 = (double)(~(ulong)local_d0 + pIVar1->ia_np);
    if (pIVar1->ia_np - (long)local_38 <= (long)local_d0) {
      local_b8 = (double)((long)local_38 - 1);
    }
    if (local_c4 != 0) {
      if (pIVar1->ia_tinitial < pIVar1->ia_tfinal) goto LAB_0011931d;
      if (-1 < (int)uVar11) {
        local_a8 = ppIVar2 + ((long)local_b8 - 1);
        local_b8 = (double)((ulong)uVar11 + 1);
        lVar10 = uVar13 - 1;
        auVar19._8_4_ = (int)lVar10;
        auVar19._0_8_ = lVar10;
        auVar19._12_4_ = (int)((ulong)lVar10 >> 0x20);
        dVar15 = 0.0;
        local_98 = auVar19 ^ _DAT_00134060;
        do {
          pIVar3 = local_a8[(long)dVar15];
          pIVar1->ia_T[(long)dVar15] = pIVar3->t;
          puVar4 = (undefined8 *)pIVar3->content;
          N_VScale(0x3ff0000000000000,*puVar4,pIVar1->ia_Y[(long)dVar15]);
          auVar19 = _DAT_00134060;
          if (0 < iVar6) {
            psVar12 = IDA_mem->ida_cvals;
            lVar10 = 0;
            auVar20 = _DAT_00134050;
            do {
              bVar5 = local_98._0_4_ < SUB164(auVar20 ^ auVar19,0);
              iVar7 = SUB164(auVar20 ^ auVar19,4);
              iVar25 = local_98._4_4_;
              if ((bool)(~(iVar25 < iVar7 || iVar7 == iVar25 && bVar5) & 1)) {
                *(undefined8 *)((long)psVar12 + lVar10) = 0x3ff0000000000000;
              }
              if (iVar25 >= iVar7 && (iVar7 != iVar25 || !bVar5)) {
                *(undefined8 *)((long)psVar12 + lVar10 + 8) = 0x3ff0000000000000;
              }
              lVar8 = auVar20._8_8_;
              auVar20._0_8_ = auVar20._0_8_ + 2;
              auVar20._8_8_ = lVar8 + 2;
              lVar10 = lVar10 + 0x10;
            } while ((ulong)(iVar6 + 1U >> 1) << 4 != lVar10);
            iVar7 = N_VScaleVectorArray(uVar13,psVar12,puVar4[1]);
            if (iVar7 != 0) {
              return -0x1c;
            }
          }
          dVar15 = (double)((long)dVar15 + 1);
        } while (dVar15 != local_b8);
        goto LAB_001195bd;
      }
      goto LAB_00119733;
    }
LAB_001196cb:
    psVar12 = IDA_mem->ida_cvals;
    *psVar12 = 1.0;
    if (0 < SUB84(local_d0,0)) {
      dVar22 = 1.0;
      uVar9 = 0;
      do {
        dVar22 = ((local_c0 - pIVar1->ia_T[uVar9]) * dVar22) / dVar15;
        psVar12[uVar9 + 1] = dVar22;
        uVar9 = uVar9 + 1;
      } while (((ulong)local_d0 & 0xffffffff) != uVar9);
    }
  }
  else {
    local_d0 = (double)(long)*(int *)((long)ppIVar2[(long)local_38]->content + 0x20);
    local_b8 = local_d0;
    if ((long)local_d0 < (long)local_38) {
      local_b8 = local_38;
    }
    if (local_c4 == 0) goto LAB_001196cb;
LAB_0011931d:
    if (-1 < SUB84(local_d0,0)) {
      local_98._4_4_ = 0;
      local_98._0_4_ = SUB84(local_d0,0) + 1;
      local_98._8_8_ = auVar19._8_8_;
      lVar10 = uVar13 - 1;
      auVar17._8_4_ = (int)lVar10;
      auVar17._0_8_ = lVar10;
      auVar17._12_4_ = (int)((ulong)lVar10 >> 0x20);
      lVar10 = 0;
      local_68 = auVar17 ^ _DAT_00134060;
      do {
        pIVar3 = local_a8[(long)local_b8 - lVar10];
        pIVar1->ia_T[lVar10] = pIVar3->t;
        puVar4 = (undefined8 *)pIVar3->content;
        N_VScale(0x3ff0000000000000,*puVar4,pIVar1->ia_Y[lVar10]);
        auVar19 = _DAT_00134060;
        if (0 < iVar6) {
          psVar12 = IDA_mem->ida_cvals;
          lVar8 = 0;
          auVar18 = _DAT_00134050;
          do {
            bVar5 = local_68._0_4_ < SUB164(auVar18 ^ auVar19,0);
            iVar7 = SUB164(auVar18 ^ auVar19,4);
            iVar25 = local_68._4_4_;
            if ((bool)(~(iVar25 < iVar7 || iVar7 == iVar25 && bVar5) & 1)) {
              *(undefined8 *)((long)psVar12 + lVar8) = 0x3ff0000000000000;
            }
            if (iVar25 >= iVar7 && (iVar7 != iVar25 || !bVar5)) {
              *(undefined8 *)((long)psVar12 + lVar8 + 8) = 0x3ff0000000000000;
            }
            lVar21 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 2;
            auVar18._8_8_ = lVar21 + 2;
            lVar8 = lVar8 + 0x10;
          } while ((ulong)(iVar6 + 1U >> 1) << 4 != lVar8);
          iVar7 = N_VScaleVectorArray(uVar13,psVar12,puVar4[1]);
          if (iVar7 != 0) {
            return -0x1c;
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != local_98._0_8_);
LAB_001195bd:
      if (0 < SUB84(local_d0,0)) {
        local_68._0_8_ = (ulong)local_d0 & 0xffffffff;
        local_40 = (ulong)(SUB84(local_d0,0) + 1);
        local_98._0_8_ = uVar13;
        uVar9 = 1;
        do {
          lVar10 = local_68._0_8_;
          dVar15 = (double)local_58._0_8_;
          uVar14 = local_58._8_8_;
          do {
            local_a8 = (IDAdtpntMemRec **)
                       (dVar15 / (pIVar1->ia_T[lVar10] -
                                 *(double *)((long)pIVar1 + (lVar10 - uVar9) * 8 + 0x128)));
            local_b8 = -(double)local_a8;
            uStack_b0 = uVar14 ^ 0x8000000000000000;
            uStack_a0 = uVar14;
            N_VLinearSum(local_a8,pIVar1->ia_Y[lVar10],pIVar1->ia_Y[lVar10 + -1],
                         pIVar1->ia_Y[lVar10]);
            if (0 < (int)local_98._0_4_) {
              uVar14 = 0;
              do {
                N_VLinearSum(local_a8,local_b8,pIVar1->ia_YS[lVar10][uVar14],
                             (&pIVar1->ia_Y[lVar10 + 5]->content)[uVar14],
                             pIVar1->ia_YS[lVar10][uVar14]);
                uVar14 = uVar14 + 1;
              } while (uVar13 != uVar14);
            }
            bVar5 = (long)uVar9 < lVar10;
            lVar10 = lVar10 + -1;
            dVar15 = (double)local_58._0_8_;
            uVar14 = local_58._8_8_;
          } while (bVar5);
          uVar9 = uVar9 + 1;
        } while (uVar9 != local_40);
        uVar13 = local_98._0_8_;
        goto LAB_001196cb;
      }
    }
LAB_00119733:
    psVar12 = IDA_mem->ida_cvals;
    *psVar12 = 1.0;
  }
  local_d8 = &IDA_mem->ida_cvals;
  uVar11 = SUB84(local_d0,0) + 1;
  iVar6 = N_VLinearCombination(uVar11,psVar12,pIVar1->ia_Y);
  if (iVar6 != 0) {
    return -0x1c;
  }
  if ((0 < (int)uVar13) &&
     (iVar6 = N_VLinearCombinationVectorArray
                        (uVar13 & 0xffffffff,uVar11,*local_d8,pIVar1->ia_YS,local_78), iVar6 != 0))
  {
    return -0x1c;
  }
  psVar12 = *local_d8;
  if (0 < SUB84(local_d0,0)) {
    dVar15 = 1.0;
    dVar22 = 0.0;
    lVar10 = 0;
    do {
      dVar24 = (local_c0 - pIVar1->ia_T[lVar10]) / (double)local_58._0_8_;
      dVar22 = dVar22 * dVar24 + dVar15 / (double)local_58._0_8_;
      dVar15 = dVar15 * dVar24;
      psVar12[lVar10] = dVar22;
      lVar10 = lVar10 + 1;
    } while ((ulong)uVar11 - 1 != lVar10);
  }
  iVar6 = N_VLinearCombination(local_d0,psVar12,pIVar1->ia_Y + 1,local_48);
  if (iVar6 != 0) {
    return -0x1c;
  }
  if ((int)uVar13 < 1) {
    return 0;
  }
  iVar6 = N_VLinearCombinationVectorArray(uVar13,local_d0,*local_d8,pIVar1->ia_YS + 1,local_80);
LAB_0011984e:
  if (iVar6 == 0) {
    return 0;
  }
  return -0x1c;
}

Assistant:

static int IDAApolynomialGetY(IDAMem IDA_mem, sunrealtype t, N_Vector yy,
                              N_Vector yp, N_Vector* yyS, N_Vector* ypS)
{
  IDAadjMem IDAADJ_mem;
  IDAdtpntMem* dt_mem;
  IDApolynomialDataMem content;

  int flag, dir, order, i, j, is, NS, retval;
  long int index, base;
  sunbooleantype newpoint;
  sunrealtype delt, factor, Psi, Psiprime;

  IDAADJ_mem = IDA_mem->ida_adj_mem;
  dt_mem     = IDAADJ_mem->dt_mem;

  /* Local value of Ns */
  NS = (IDAADJ_mem->ia_interpSensi && (yyS != NULL)) ? IDA_mem->ida_Ns : 0;

  /* Get the index in dt_mem */
  flag = IDAAfindIndex(IDA_mem, t, &index, &newpoint);
  if (flag != IDA_SUCCESS) { return (flag); }

  /* If we are beyond the left limit but close enough,
     then return y at the left limit. */

  if (index == 0)
  {
    content = (IDApolynomialDataMem)(dt_mem[0]->content);
    N_VScale(ONE, content->y, yy);
    N_VScale(ONE, content->yd, yp);

    if (NS > 0)
    {
      for (is = 0; is < NS; is++) { IDA_mem->ida_cvals[is] = ONE; }

      retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->yS, yyS);
      if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

      retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->ySd, ypS);
      if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
    }

    return (IDA_SUCCESS);
  }

  /* Scaling factor */
  delt = SUNRabs(dt_mem[index]->t - dt_mem[index - 1]->t);

  /* Find the direction of the forward integration */
  dir = (IDAADJ_mem->ia_tfinal - IDAADJ_mem->ia_tinitial > ZERO) ? 1 : -1;

  /* Establish the base point depending on the integration direction.
     Modify the base if there are not enough points for the current order */

  if (dir == 1)
  {
    base    = index;
    content = (IDApolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (index < order) { base += order - index; }
  }
  else
  {
    base    = index - 1;
    content = (IDApolynomialDataMem)(dt_mem[base]->content);
    order   = content->order;
    if (IDAADJ_mem->ia_np - index > order)
    {
      base -= index + order - IDAADJ_mem->ia_np;
    }
  }

  /* Recompute Y (divided differences for Newton polynomial) if needed */

  if (newpoint)
  {
    /* Store 0-th order DD */
    if (dir == 1)
    {
      for (j = 0; j <= order; j++)
      {
        IDAADJ_mem->ia_T[j] = dt_mem[base - j]->t;
        content             = (IDApolynomialDataMem)(dt_mem[base - j]->content);
        N_VScale(ONE, content->y, IDAADJ_mem->ia_Y[j]);

        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { IDA_mem->ida_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->yS,
                                       IDAADJ_mem->ia_YS[j]);
          if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
        }
      }
    }
    else
    {
      for (j = 0; j <= order; j++)
      {
        IDAADJ_mem->ia_T[j] = dt_mem[base - 1 + j]->t;
        content = (IDApolynomialDataMem)(dt_mem[base - 1 + j]->content);
        N_VScale(ONE, content->y, IDAADJ_mem->ia_Y[j]);

        if (NS > 0)
        {
          for (is = 0; is < NS; is++) { IDA_mem->ida_cvals[is] = ONE; }
          retval = N_VScaleVectorArray(NS, IDA_mem->ida_cvals, content->yS,
                                       IDAADJ_mem->ia_YS[j]);
          if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
        }
      }
    }

    /* Compute higher-order DD */
    for (i = 1; i <= order; i++)
    {
      for (j = order; j >= i; j--)
      {
        factor = delt / (IDAADJ_mem->ia_T[j] - IDAADJ_mem->ia_T[j - i]);
        N_VLinearSum(factor, IDAADJ_mem->ia_Y[j], -factor,
                     IDAADJ_mem->ia_Y[j - 1], IDAADJ_mem->ia_Y[j]);

        for (is = 0; is < NS; is++)
        {
          N_VLinearSum(factor, IDAADJ_mem->ia_YS[j][is], -factor,
                       IDAADJ_mem->ia_YS[j - 1][is], IDAADJ_mem->ia_YS[j][is]);
        }
      }
    }
  }

  /* Perform the actual interpolation for yy using nested multiplications */

  IDA_mem->ida_cvals[0] = ONE;
  for (i = 0; i < order; i++)
  {
    IDA_mem->ida_cvals[i + 1] = IDA_mem->ida_cvals[i] *
                                (t - IDAADJ_mem->ia_T[i]) / delt;
  }

  retval = N_VLinearCombination(order + 1, IDA_mem->ida_cvals, IDAADJ_mem->ia_Y,
                                yy);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  if (NS > 0)
  {
    retval = N_VLinearCombinationVectorArray(NS, order + 1, IDA_mem->ida_cvals,
                                             IDAADJ_mem->ia_YS, yyS);
    if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
  }

  /* Perform the actual interpolation for yp.

     Writing p(t) = y0 + (t-t0)*f[t0,t1] + ... + (t-t0)(t-t1)...(t-tn)*f[t0,t1,...tn],
     denote psi_k(t) = (t-t0)(t-t1)...(t-tk).

     The formula used for p'(t) is:
       - p'(t) = f[t0,t1] + psi_1'(t)*f[t0,t1,t2] + ... + psi_n'(t)*f[t0,t1,...,tn]

     We recursively compute psi_k'(t) from:
       - psi_k'(t) = (t-tk)*psi_{k-1}'(t) + psi_{k-1}

     psi_k is rescaled with 1/delt each time is computed, because the Newton DDs from Y were
     scaled with delt.
  */

  Psi      = ONE;
  Psiprime = ZERO;

  for (i = 1; i <= order; i++)
  {
    factor = (t - IDAADJ_mem->ia_T[i - 1]) / delt;

    Psiprime = Psi / delt + factor * Psiprime;
    Psi      = Psi * factor;

    IDA_mem->ida_cvals[i - 1] = Psiprime;
  }

  retval = N_VLinearCombination(order, IDA_mem->ida_cvals, IDAADJ_mem->ia_Y + 1,
                                yp);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  if (NS > 0)
  {
    retval = N_VLinearCombinationVectorArray(NS, order, IDA_mem->ida_cvals,
                                             IDAADJ_mem->ia_YS + 1, ypS);
    if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }
  }

  return (IDA_SUCCESS);
}